

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotorRotationDriveline.cpp
# Opt level: O1

void __thiscall
chrono::ChLinkMotorRotationDriveline::ChLinkMotorRotationDriveline
          (ChLinkMotorRotationDriveline *this,ChLinkMotorRotationDriveline *other)

{
  ChLinkMotorRotation::ChLinkMotorRotation
            (&this->super_ChLinkMotorRotation,&other->super_ChLinkMotorRotation);
  *(undefined ***)
   &(this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.super_ChLinkMate.
    super_ChLink.super_ChLinkBase.super_ChPhysicsItem = &PTR__ChLinkMotorRotationDriveline_00b46af0;
  *(undefined8 *)&(this->super_ChLinkMotorRotation).field_0x278 = 0;
  *(undefined8 *)&this->field_0x280 = 0;
  (this->innershaft2).super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->innershaft2).super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->innerconstraint1).super___shared_ptr<chrono::ChShaftsBody,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->innerconstraint1).super___shared_ptr<chrono::ChShaftsBody,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->innerconstraint2).super___shared_ptr<chrono::ChShaftsBody,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->innerconstraint2).super___shared_ptr<chrono::ChShaftsBody,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined8 *)&(this->super_ChLinkMotorRotation).field_0x278 =
       *(undefined8 *)&(other->super_ChLinkMotorRotation).field_0x278;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->field_0x280,
             (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&other->field_0x280);
  (this->innershaft2).super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (other->innershaft2).super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->innershaft2).super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             &(other->innershaft2).super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  (this->innerconstraint1).super___shared_ptr<chrono::ChShaftsBody,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (other->innerconstraint1).
           super___shared_ptr<chrono::ChShaftsBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->innerconstraint1).
              super___shared_ptr<chrono::ChShaftsBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &(other->innerconstraint1).
              super___shared_ptr<chrono::ChShaftsBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  (this->innerconstraint2).super___shared_ptr<chrono::ChShaftsBody,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (other->innerconstraint2).
           super___shared_ptr<chrono::ChShaftsBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->innerconstraint2).
              super___shared_ptr<chrono::ChShaftsBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &(other->innerconstraint2).
              super___shared_ptr<chrono::ChShaftsBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

ChLinkMotorRotationDriveline::ChLinkMotorRotationDriveline(const ChLinkMotorRotationDriveline& other)
    : ChLinkMotorRotation(other) {
    innershaft1 = other.innershaft1;
    innershaft2 = other.innershaft2;
    innerconstraint1 = other.innerconstraint1;
    innerconstraint2 = other.innerconstraint2;
}